

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode ws_dec_pass_payload(ws_decoder *dec,Curl_easy *data,bufq *inraw,
                            ws_write_payload *write_payload,void *write_ctx)

{
  undefined8 uVar1;
  _Bool local_61;
  long local_60;
  curl_off_t remain;
  size_t sStack_50;
  CURLcode result;
  ssize_t nwritten;
  size_t inlen;
  uchar *inbuf;
  void *write_ctx_local;
  ws_write_payload *write_payload_local;
  bufq *inraw_local;
  Curl_easy *data_local;
  ws_decoder *dec_local;
  
  local_60 = dec->payload_len - dec->payload_offset;
  inbuf = (uchar *)write_ctx;
  write_ctx_local = write_payload;
  write_payload_local = (ws_write_payload *)inraw;
  inraw_local = (bufq *)data;
  data_local = (Curl_easy *)dec;
  while( true ) {
    local_61 = false;
    if (local_60 != 0) {
      local_61 = Curl_bufq_peek((bufq *)write_payload_local,(uchar **)&inlen,(size_t *)&nwritten);
    }
    if (local_61 == false) {
      if (local_60 == 0) {
        return CURLE_OK;
      }
      return CURLE_AGAIN;
    }
    if (local_60 < nwritten) {
      nwritten = local_60;
    }
    uVar1._0_4_ = data_local->mid;
    uVar1._4_4_ = data_local->master_mid;
    sStack_50 = (*(code *)write_ctx_local)
                          (inlen,nwritten,data_local->magic,*(undefined4 *)&data_local->field_0x4,
                           data_local->id,uVar1,inbuf,(long)&remain + 4);
    if ((long)sStack_50 < 0) break;
    Curl_bufq_skip((bufq *)write_payload_local,sStack_50);
    data_local->id = sStack_50 + data_local->id;
    local_60 = *(long *)&data_local->mid - data_local->id;
    if ((((inraw_local != (bufq *)0x0) &&
         ((*(ulong *)((long)&inraw_local[0x28].max_chunks + 4) >> 0x1e & 1) != 0)) &&
        ((inraw_local[0x4c].spare == (buf_chunk *)0x0 || (0 < (int)(inraw_local[0x4c].spare)->dlen))
        )) && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write((Curl_easy *)inraw_local,"websocket, passed %zd bytes payload, %ld remain",
                     sStack_50,local_60);
    }
  }
  return remain._4_4_;
}

Assistant:

static CURLcode ws_dec_pass_payload(struct ws_decoder *dec,
                                    struct Curl_easy *data,
                                    struct bufq *inraw,
                                    ws_write_payload *write_payload,
                                    void *write_ctx)
{
  const unsigned char *inbuf;
  size_t inlen;
  ssize_t nwritten;
  CURLcode result;
  curl_off_t remain = dec->payload_len - dec->payload_offset;

  (void)data;
  while(remain && Curl_bufq_peek(inraw, &inbuf, &inlen)) {
    if((curl_off_t)inlen > remain)
      inlen = (size_t)remain;
    nwritten = write_payload(inbuf, inlen, dec->frame_age, dec->frame_flags,
                             dec->payload_offset, dec->payload_len,
                             write_ctx, &result);
    if(nwritten < 0)
      return result;
    Curl_bufq_skip(inraw, (size_t)nwritten);
    dec->payload_offset += (curl_off_t)nwritten;
    remain = dec->payload_len - dec->payload_offset;
    CURL_TRC_WRITE(data, "websocket, passed %zd bytes payload, %"
                   FMT_OFF_T " remain", nwritten, remain);
  }

  return remain ? CURLE_AGAIN : CURLE_OK;
}